

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CreateSourceFramebuffer<2u>(CopyTest *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 *puVar4;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6d0))(1,&this->m_fbo);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14e6);
  (**(code **)(lVar3 + 0x78))(0x8d40,this->m_fbo);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14e9);
  (**(code **)(lVar3 + 0x6a0))(0x8d40,0x8ce0,0xde1,this->m_to_src,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glFramebufferTexture1D call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x14ec);
  iVar1 = (**(code **)(lVar3 + 0x170))(0x8d40);
  if (iVar1 == 0x8cd5) {
    (**(code **)(lVar3 + 0x1a00))(0,0,4,4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glViewport call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x14f4);
    return;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

void CopyTest::CreateSourceFramebuffer<2>()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare framebuffer. */
	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call failed.");

	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, TextureTarget<2>(), m_to_src, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D call failed.");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
	{
		throw 0;
	}

	gl.viewport(0, 0, s_texture_width, s_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport call failed.");
}